

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

int __thiscall IMLE::init(IMLE *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  allocator local_41;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)(long)this->d;
  local_40.field_2._M_allocated_capacity = 0;
  local_40._M_string_length = (size_type)local_40._M_dataplus._M_p;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->zeroZZ,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_40);
  local_40._M_dataplus._M_p = (pointer)(long)this->d;
  local_40.field_2._M_allocated_capacity = 0x7ff0000000000000;
  local_40._M_string_length = (size_type)local_40._M_dataplus._M_p;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->infinityZZ,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_40);
  local_40._M_dataplus._M_p = (pointer)(long)this->d;
  local_40.field_2._M_allocated_capacity = 0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&this->zeroZ,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_40);
  local_40._M_dataplus._M_p = (pointer)(long)this->D;
  local_40.field_2._M_allocated_capacity = 0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&this->zeroX,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_40);
  local_40._M_dataplus._M_p = (pointer)(long)this->D;
  local_40.field_2._M_allocated_capacity = 0x7ff0000000000000;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&this->infinityX,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_40);
  local_40._M_dataplus._M_p = (pointer)(long)this->D;
  local_40._M_string_length = (size_type)this->d;
  local_40.field_2._M_allocated_capacity = 0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->zeroXZ,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_40);
  local_40._M_dataplus._M_p = (pointer)(long)this->D;
  local_40._M_string_length = (size_type)this->d;
  local_40.field_2._M_allocated_capacity = 0x7ff0000000000000;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->infinityXZ,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_40);
  std::vector<int,_std::allocator<int>_>::reserve(&this->sNearest,0x800);
  std::vector<int,_std::allocator<int>_>::reserve(&this->sNearestInv,0x800);
  std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::reserve
            (&(this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ,(long)(int)ctx);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&this->predictions,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&this->predictionsVar,0x10);
  std::vector<double,_std::allocator<double>_>::reserve(&this->predictionsWeight,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(&this->predictionsJacobian,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(&this->predictionsVarJacobian,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&this->invPredictions,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(&this->invPredictionsVar,0x10);
  std::vector<double,_std::allocator<double>_>::reserve(&this->invPredictionsWeight,0x10);
  std::__cxx11::string::string((string *)&local_40,"IMLE object created.",&local_41);
  message(this,&local_40);
  iVar1 = std::__cxx11::string::_M_dispose();
  return iVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::init(int pre_alloc)
{
    zeroZZ = ZZ::Zero(d,d); //Template: ZZ::Zero()
    infinityZZ = ZZ::Constant( d,d, std::numeric_limits<Scal>::infinity() ); //Template: ZZ::Constant( std::numeric_limits<Scal>::infinity() )
    zeroZ = Z::Zero(d);     //Template: Z::Zero()
    zeroX = X::Zero(D);     //Template: X::Zero()
	infinityX = X::Constant( D, std::numeric_limits<Scal>::infinity() ); //Template: X::Constant( std::numeric_limits<Scal>::infinity() )
    zeroXZ = XZ::Zero(D,d); //Template: XZ::Zero()
    infinityXZ = XZ::Constant( D,d, std::numeric_limits<Scal>::infinity() ); //Template: XZ::Constant( std::numeric_limits<Scal>::infinity() )

    sNearest.reserve(INIT_SIZE);
    sNearestInv.reserve(INIT_SIZE);

    experts.reserve( pre_alloc );

	predictions.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsVar.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsWeight.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsJacobian.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsVarJacobian.reserve(MAX_NUMBER_OF_SOLUTIONS);
	invPredictions.reserve(MAX_NUMBER_OF_SOLUTIONS);
	invPredictionsVar.reserve(MAX_NUMBER_OF_SOLUTIONS);
	invPredictionsWeight.reserve(MAX_NUMBER_OF_SOLUTIONS);

	message(IMLE_CRTD);
}